

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,ImVec2 grid_off,float rounding,
               int rounding_corners_flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ImU32 col_00;
  byte bVar6;
  float fVar7;
  float fVar8;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_84;
  float local_80;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar2 = GImGui;
  local_68._8_4_ = in_XMM3_Dc;
  local_68._0_8_ = grid_off;
  local_68._12_4_ = in_XMM3_Dd;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  local_98 = p_max;
  local_90 = p_min;
  if (col < 0xff000000) {
    fVar7 = (float)(col >> 0x18) / 255.0;
    uVar5 = col >> 8 & 0xff;
    uVar3 = col >> 0x10 & 0xff;
    uVar4 = (int)((float)(int)(uVar5 - 0xcc) * fVar7 + 204.0) << 8 |
            (int)((float)(int)((col & 0xff) - 0xcc) * fVar7 + 204.0) |
            (int)((float)(int)(uVar3 - 0xcc) * fVar7 + 204.0) << 0x10;
    fVar8 = (pIVar2->Style).Alpha;
    if (1.0 <= fVar8) {
      col_00 = uVar4 | 0xff000000;
    }
    else {
      col_00 = (int)(long)(fVar8 * 255.0) << 0x18 | uVar4 & 0xffffff;
    }
    uVar3 = (int)((float)(int)(uVar5 - 0x80) * fVar7 + 128.0) << 8 |
            (int)((float)(int)((col & 0xff) - 0x80) * fVar7 + 128.0) |
            (int)((float)(int)(uVar3 - 0x80) * fVar7 + 128.0) << 0x10;
    if (1.0 <= fVar8) {
      uVar3 = uVar3 | 0xff000000;
    }
    else {
      uVar3 = (int)(long)(fVar8 * 255.0) << 0x18 | uVar3 & 0xffffff;
    }
    local_84 = grid_step;
    ImDrawList::AddRectFilled
              (pIVar1->DrawList,&local_90,&local_98,col_00,rounding,rounding_corners_flags);
    local_58 = (float)local_68._4_4_ + local_90.y;
    if (local_58 < local_98.y) {
      bVar6 = 0;
      fStack_54 = (float)local_68._4_4_;
      fStack_50 = (float)local_68._4_4_;
      fStack_4c = (float)local_68._4_4_;
      fVar8 = local_84;
      do {
        fVar7 = local_98.y;
        if (local_58 <= local_98.y) {
          fVar7 = local_58;
        }
        local_70.y = (float)(-(uint)(local_58 < local_90.y) & (uint)local_90.y |
                            ~-(uint)(local_58 < local_90.y) & (uint)fVar7);
        local_58 = local_58 + fVar8;
        local_78.y = local_58;
        if (local_98.y <= local_58) {
          local_78.y = local_98.y;
        }
        if (local_70.y < local_78.y) {
          local_7c = (float)bVar6 * fVar8 + local_90.x + (float)local_68._0_4_;
          if (local_7c < local_98.x) {
            uStack_44 = 0;
            uStack_40 = 0;
            uStack_3c = 0;
            local_80 = local_78.y;
            local_48 = local_70.y;
            do {
              fVar7 = local_98.x;
              if (local_7c <= local_98.x) {
                fVar7 = local_7c;
              }
              local_70.x = (float)(-(uint)(local_7c < local_90.x) & (uint)local_90.x |
                                  ~-(uint)(local_7c < local_90.x) & (uint)fVar7);
              local_78.x = local_7c + fVar8;
              if (local_98.x <= local_7c + fVar8) {
                local_78.x = local_98.x;
              }
              if (local_70.x < local_78.x) {
                uVar4 = 0;
                if (local_70.y <= local_90.y) {
                  uVar4 = (uint)(local_70.x <= local_90.x);
                  if (local_98.x <= local_78.x) {
                    uVar4 = local_70.x <= local_90.x | 2;
                  }
                }
                if (local_98.y <= local_78.y) {
                  if (local_70.x <= local_90.x) {
                    uVar4 = uVar4 + 4;
                  }
                  if (local_98.x <= local_78.x) {
                    uVar4 = uVar4 | 8;
                  }
                }
                fVar8 = 0.0;
                if ((uVar4 & rounding_corners_flags) != 0) {
                  fVar8 = rounding;
                }
                ImDrawList::AddRectFilled
                          (pIVar1->DrawList,&local_70,&local_78,uVar3,fVar8,
                           uVar4 & rounding_corners_flags);
                fVar8 = local_84;
                local_78.y = local_80;
                local_70.y = local_48;
              }
              local_7c = local_7c + fVar8 + fVar8;
            } while (local_7c < local_98.x);
          }
        }
        bVar6 = bVar6 ^ 1;
      } while (local_58 < local_98.y);
    }
  }
  else {
    ImDrawList::AddRectFilled
              (pIVar1->DrawList,&local_90,&local_98,col,rounding,rounding_corners_flags);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColor(IM_COL32(204,204,204,255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColor(IM_COL32(128,128,128,255), col));
        window->DrawList->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                window->DrawList->AddRectFilled(ImVec2(x1,y1), ImVec2(x2,y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        window->DrawList->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}